

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

int __thiscall piksel::Image::_load(Image *this,uchar *data)

{
  int iVar1;
  
  if (data == (uchar *)0x0) {
    _load();
  }
  else {
    (*glad_glGenTextures)(1,&this->_texture);
    (*glad_glBindTexture)(0xde1,this->_texture);
    (*glad_glTexImage2D)(0xde1,0,0x1908,this->width,this->height,0,0x1908,0x1401,data);
    (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
    (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2600);
    stbi_image_free(data);
    iVar1 = _load::imageIndex + 1;
    this->_index = _load::imageIndex;
    _load::imageIndex = iVar1;
  }
  return (uint)(data != (uchar *)0x0);
}

Assistant:

int Image::_load(unsigned char* data) {
	static int imageIndex = 1; // shape texture uses index 0
	if (!data) {
		fprintf(stderr, "%s\n", stbi_failure_reason());
		return 0;
	}
	glGenTextures(1, &_texture);
	glBindTexture(GL_TEXTURE_2D, _texture);
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, data);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	stbi_image_free(data);
    _index = imageIndex++;
    return 1;
}